

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O1

void __thiscall dxil_spv::CFGStructurizer::insert_phi(CFGStructurizer *this)

{
  pointer pPVar1;
  pointer *pppCVar2;
  pointer *ppPVar3;
  pointer ppCVar4;
  pointer ppCVar5;
  pointer ppCVar6;
  CFGNode *pCVar7;
  pointer pPVar8;
  iterator __position;
  pointer ppOVar9;
  pointer pPVar10;
  long lVar11;
  uint uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  __dest;
  pointer ppCVar15;
  mapped_type *ppCVar16;
  ulong uVar17;
  pointer pPVar18;
  uint uVar19;
  pointer pPVar20;
  PHI *phi;
  pointer __k;
  PHINode *phi_node;
  pointer ppOVar21;
  __normal_iterator<dxil_spv::CFGStructurizer::PHINode_*,_std::vector<dxil_spv::CFGStructurizer::PHINode,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGStructurizer::PHINode>_>_>
  __i;
  pointer pPVar22;
  CFGNode *back_edge;
  PHINode local_58;
  pointer local_48;
  pointer local_40;
  Vector<PHINode> *local_38;
  
  ppCVar15 = (this->forward_post_visit_order).
             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppCVar4 = (this->forward_post_visit_order).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pCVar7 = local_58.block;
  do {
    if (ppCVar15 == ppCVar4) {
      local_58.block = pCVar7;
      prune_dead_preds(this);
      fixup_broken_value_dominance(this);
      ppCVar15 = (this->forward_post_visit_order).
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      local_48 = (this->forward_post_visit_order).
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (ppCVar15 != local_48) {
        local_38 = &this->phi_nodes;
        do {
          pCVar7 = *ppCVar15;
          __k = (pCVar7->ir).phi.
                super__Vector_base<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>.
                _M_impl.super__Vector_impl_data._M_start;
          pPVar8 = (pCVar7->ir).phi.
                   super__Vector_base<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          local_40 = ppCVar15;
          if (__k != pPVar8) {
            uVar19 = 0;
            do {
              __position._M_current =
                   (this->phi_nodes).
                   super__Vector_base<dxil_spv::CFGStructurizer::PHINode,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGStructurizer::PHINode>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              local_58.block = pCVar7;
              local_58.phi_index = uVar19;
              if (__position._M_current ==
                  (this->phi_nodes).
                  super__Vector_base<dxil_spv::CFGStructurizer::PHINode,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGStructurizer::PHINode>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<dxil_spv::CFGStructurizer::PHINode,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGStructurizer::PHINode>_>
                ::_M_realloc_insert<dxil_spv::CFGStructurizer::PHINode>
                          (local_38,__position,&local_58);
              }
              else {
                (__position._M_current)->block = pCVar7;
                *(ulong *)&(__position._M_current)->phi_index = CONCAT44(local_58._12_4_,uVar19);
                ppPVar3 = &(this->phi_nodes).
                           super__Vector_base<dxil_spv::CFGStructurizer::PHINode,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGStructurizer::PHINode>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *ppPVar3 = *ppPVar3 + 1;
              }
              if (__k->id != 0) {
                ppCVar16 = std::__detail::
                           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::CFGNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::CFGNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                         *)&this->value_id_to_block,&__k->id);
                *ppCVar16 = pCVar7;
              }
              uVar19 = uVar19 + 1;
              __k = __k + 1;
            } while (__k != pPVar8);
          }
          ppOVar9 = (pCVar7->ir).operations.
                    super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (ppOVar21 = (pCVar7->ir).operations.
                          super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
                          ._M_impl.super__Vector_impl_data._M_start; ppOVar21 != ppOVar9;
              ppOVar21 = ppOVar21 + 1) {
            if ((*ppOVar21)->id != 0) {
              ppCVar16 = std::__detail::
                         _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::CFGNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::CFGNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                       *)&this->value_id_to_block,&(*ppOVar21)->id);
              *ppCVar16 = pCVar7;
            }
          }
          ppCVar15 = local_40 + 1;
        } while (ppCVar15 != local_48);
      }
      pPVar18 = (this->phi_nodes).
                super__Vector_base<dxil_spv::CFGStructurizer::PHINode,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGStructurizer::PHINode>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pPVar10 = (this->phi_nodes).
                super__Vector_base<dxil_spv::CFGStructurizer::PHINode,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGStructurizer::PHINode>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (pPVar18 != pPVar10) {
        uVar17 = (long)pPVar10 - (long)pPVar18 >> 4;
        lVar11 = 0x3f;
        if (uVar17 != 0) {
          for (; uVar17 >> lVar11 == 0; lVar11 = lVar11 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<dxil_spv::CFGStructurizer::PHINode*,std::vector<dxil_spv::CFGStructurizer::PHINode,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGStructurizer::PHINode>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<dxil_spv::CFGStructurizer::insert_phi()::__0>>
                  (pPVar18,pPVar10,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
        if ((long)pPVar10 - (long)pPVar18 < 0x101) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<dxil_spv::CFGStructurizer::PHINode*,std::vector<dxil_spv::CFGStructurizer::PHINode,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGStructurizer::PHINode>>>,__gnu_cxx::__ops::_Iter_comp_iter<dxil_spv::CFGStructurizer::insert_phi()::__0>>
                    (pPVar18,pPVar10);
        }
        else {
          pPVar22 = pPVar18 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<dxil_spv::CFGStructurizer::PHINode*,std::vector<dxil_spv::CFGStructurizer::PHINode,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGStructurizer::PHINode>>>,__gnu_cxx::__ops::_Iter_comp_iter<dxil_spv::CFGStructurizer::insert_phi()::__0>>
                    (pPVar18,pPVar22);
          for (; pPVar22 != pPVar10; pPVar22 = pPVar22 + 1) {
            pCVar7 = pPVar22->block;
            uVar19 = pPVar22->phi_index;
            uVar14 = *(undefined4 *)&pPVar22->field_0xc;
            pPVar18 = pPVar22;
            pPVar20 = pPVar22;
            if ((pPVar22[-1].block)->forward_post_visit_order < pCVar7->forward_post_visit_order) {
              do {
                pPVar18 = pPVar20 + -1;
                uVar12 = pPVar20[-1].phi_index;
                uVar13 = *(undefined4 *)&pPVar20[-1].field_0xc;
                pPVar20->block = pPVar20[-1].block;
                pPVar20->phi_index = uVar12;
                *(undefined4 *)&pPVar20->field_0xc = uVar13;
                pPVar1 = pPVar20 + -2;
                pPVar20 = pPVar18;
              } while (pPVar1->block->forward_post_visit_order < pCVar7->forward_post_visit_order);
            }
            pPVar18->block = pCVar7;
            pPVar18->phi_index = uVar19;
            *(undefined4 *)&pPVar18->field_0xc = uVar14;
          }
        }
      }
      pPVar10 = (this->phi_nodes).
                super__Vector_base<dxil_spv::CFGStructurizer::PHINode,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGStructurizer::PHINode>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (pPVar18 = (this->phi_nodes).
                     super__Vector_base<dxil_spv::CFGStructurizer::PHINode,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGStructurizer::PHINode>_>
                     ._M_impl.super__Vector_impl_data._M_start; pPVar18 != pPVar10;
          pPVar18 = pPVar18 + 1) {
        fixup_phi(this,pPVar18);
        insert_phi(this,pPVar18);
      }
      return;
    }
    local_58.block = (*ppCVar15)->pred_back_edge;
    if (((local_58.block != (CFGNode *)0x0) && (((local_58.block)->ir).terminator.type == Branch))
       && ((local_58.block)->succ_back_edge == ((local_58.block)->ir).terminator.direct_block)) {
      ppCVar5 = ((local_58.block)->succ).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppCVar6 = ((local_58.block)->succ).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if ((long)ppCVar6 - (long)ppCVar5 == 8) {
        pCVar7 = *ppCVar5;
        if (ppCVar6 != ppCVar5) {
          ((local_58.block)->succ).
          super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = ppCVar5;
        }
        __dest = std::
                 __find_if<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,__gnu_cxx::__ops::_Iter_equals_val<dxil_spv::CFGNode*const>>
                           ((pCVar7->pred).
                            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (pCVar7->pred).
                            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish,&local_58);
        ppCVar5 = (pCVar7->pred).
                  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (__dest._M_current == ppCVar5) {
          __assert_fail("itr != succ->pred.end()",
                        "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                        ,0x807,"void dxil_spv::CFGStructurizer::insert_phi()");
        }
        ppCVar6 = __dest._M_current + 1;
        if (ppCVar6 != ppCVar5) {
          memmove(__dest._M_current,ppCVar6,(long)ppCVar5 - (long)ppCVar6);
        }
        pppCVar2 = &(pCVar7->pred).
                    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppCVar2 = *pppCVar2 + -1;
        CFGNode::recompute_immediate_dominator(pCVar7);
        pCVar7 = local_58.block;
      }
    }
    local_58.block = pCVar7;
    ppCVar15 = ppCVar15 + 1;
    pCVar7 = local_58.block;
  } while( true );
}

Assistant:

void CFGStructurizer::insert_phi()
{
	// If we inserted dummy branches from back-edge to rewrite infinite loops, we must prune these branches
	// now, so we don't end up creating a wrong amount of PHI incoming values.
	// We don't have to recompute the CFG since we don't really care about post-visit orders at this stage.
	for (auto *node : forward_post_visit_order)
	{
		if (node->pred_back_edge && node->pred_back_edge->ir.terminator.type == Terminator::Type::Branch &&
		    node->pred_back_edge->succ_back_edge == node->pred_back_edge->ir.terminator.direct_block &&
		    node->pred_back_edge->succ.size() == 1)
		{
			auto *back_edge = node->pred_back_edge;
			auto *succ = back_edge->succ.front();
			back_edge->succ.clear();
			auto itr = std::find(succ->pred.begin(), succ->pred.end(), back_edge);
			assert(itr != succ->pred.end());
			succ->pred.erase(itr);
			succ->recompute_immediate_dominator();
		}
	}

	prune_dead_preds();

	// It is possible that an SSA value was created in a block, and consumed in another.
	// With CFG rewriting branches, it is possible that dominance relationship no longer holds
	// and we must insert new dummy IDs to resolve this.
	fixup_broken_value_dominance();

	// Build a map of value ID -> creating block.
	// This allows us to detect if a value is consumed in a situation where the declaration does not dominate use.
	// This can happen when introducing ladder blocks or similar.
	for (auto *node : forward_post_visit_order)
	{
		unsigned phi_index = 0;
		for (auto &phi : node->ir.phi)
		{
			phi_nodes.push_back({ node, phi_index });
			if (phi.id)
				value_id_to_block[phi.id] = node;
			phi_index++;
		}

		for (auto *op : node->ir.operations)
			if (op->id)
				value_id_to_block[op->id] = node;
	}

	// Resolve phi-nodes top-down since PHI nodes may depend on other PHI nodes.
	std::sort(phi_nodes.begin(), phi_nodes.end(),
	          [](const PHINode &a, const PHINode &b) { return a.block->forward_post_visit_order > b.block->forward_post_visit_order; });

	for (auto &phi_node : phi_nodes)
	{
		fixup_phi(phi_node);
		insert_phi(phi_node);
	}
}